

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall kratos::Generator::clear_remove_stmt_cache(Generator *this)

{
  bool bVar1;
  long lVar2;
  Generator *pGVar3;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  __first;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  _Var4;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *this_00;
  Generator *local_58;
  Generator *local_50;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *local_48;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *local_40;
  Generator *local_38;
  
  local_48 = &this->stmts_;
  _Var4._M_current =
       (this->stmts_).
       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_40 = &((this->stmts_).
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  lVar2 = (long)local_40 - (long)_Var4._M_current;
  local_58 = this;
  local_50 = this;
  local_38 = this;
  for (lVar6 = lVar2 >> 6; p_Var5 = local_40, this_00 = local_48, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
            operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_50,
                       _Var4);
    pGVar3 = local_38;
    __first._M_current = _Var4._M_current;
    p_Var5 = local_40;
    this_00 = local_48;
    if (bVar1) goto LAB_00161156;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
            operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_50,
                       _Var4._M_current + 1);
    pGVar3 = local_38;
    __first._M_current = _Var4._M_current + 1;
    p_Var5 = local_40;
    this_00 = local_48;
    if (bVar1) goto LAB_00161156;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
            operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_50,
                       _Var4._M_current + 2);
    pGVar3 = local_38;
    __first._M_current = _Var4._M_current + 2;
    p_Var5 = local_40;
    this_00 = local_48;
    if (bVar1) goto LAB_00161156;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
            operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_50,
                       _Var4._M_current + 3);
    pGVar3 = local_38;
    __first._M_current = _Var4._M_current + 3;
    p_Var5 = local_40;
    this_00 = local_48;
    if (bVar1) goto LAB_00161156;
    _Var4._M_current = _Var4._M_current + 4;
    lVar2 = lVar2 + -0x40;
  }
  lVar2 = lVar2 >> 4;
  pGVar3 = local_38;
  if (lVar2 == 1) {
LAB_001611e1:
    bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
            operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_50,
                       _Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar1) {
      __first._M_current = (shared_ptr<kratos::Stmt> *)p_Var5;
    }
  }
  else if (lVar2 == 2) {
LAB_001611c7:
    pGVar3 = local_38;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
            operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_50,
                       _Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar1) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_001611e1;
    }
  }
  else {
    __first._M_current = (shared_ptr<kratos::Stmt> *)local_40;
    if (lVar2 != 3) goto LAB_00161194;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
            operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_50,
                       _Var4);
    pGVar3 = local_38;
    __first._M_current = _Var4._M_current;
    if (!bVar1) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_001611c7;
    }
  }
LAB_00161156:
  if (&(__first._M_current)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> != p_Var5)
  {
    _Var4._M_current = __first._M_current;
    while (_Var4._M_current =
                (shared_ptr<kratos::Stmt> *)
                (&(_Var4._M_current)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> +
                1), (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)_Var4._M_current !=
                    local_40) {
      bVar1 = __gnu_cxx::__ops::_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::$_0>::
              operator()((_Iter_pred<kratos::Generator::clear_remove_stmt_cache()::__0> *)&local_58,
                         _Var4);
      if (!bVar1) {
        std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)_Var4._M_current);
        __first._M_current =
             (shared_ptr<kratos::Stmt> *)
             (&(__first._M_current)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> +
             1);
      }
    }
  }
LAB_00161194:
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::erase
            (this_00,(const_iterator)__first._M_current,
             (pGVar3->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Hashtable<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Stmt>_>,_std::hash<std::shared_ptr<kratos::Stmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(pGVar3->stmts_remove_cache_)._M_h);
  return;
}

Assistant:

void Generator::clear_remove_stmt_cache() {
    stmts_.erase(std::remove_if(stmts_.begin(), stmts_.end(),
                                [this](auto const &stmt) {
                                    return stmts_remove_cache_.find(stmt) !=
                                           stmts_remove_cache_.end();
                                }),
                 stmts_.end());

    stmts_remove_cache_.clear();
}